

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2Dist::set(V2Dist *this,syVDist *para)

{
  uint32_t uVar1;
  float fVar2;
  double dVar3;
  undefined1 local_28 [8];
  syVFlt setup;
  float x;
  syVDist *para_local;
  V2Dist *this_local;
  
  this->mode = (int)para->mode;
  unique0x1000017a = para;
  fVar2 = powf(2.0,(para->ingain + -32.0) * 0.0625);
  this->gain1 = fVar2;
  switch(this->mode) {
  case 0:
    break;
  case 1:
    fVar2 = stack0xffffffffffffffe8->param1;
    dVar3 = std::atan((double)(ulong)(uint)this->gain1);
    this->gain2 = (fVar2 / 128.0) / SUB84(dVar3,0);
    this->offs = this->gain1 * 2.0 * (stack0xffffffffffffffe8->param2 / 128.0 - 0.5);
    break;
  case 2:
    this->gain2 = stack0xffffffffffffffe8->param1 / 128.0;
    this->offs = this->gain1 * 2.0 * (stack0xffffffffffffffe8->param2 / 128.0 - 0.5);
    break;
  case 3:
    fVar2 = stack0xffffffffffffffe8->param1 * 256.0 + 1.0;
    this->crush2 = (int)fVar2;
    this->crush1 = this->gain1 * (32768.0 / fVar2);
    this->crxor = (int)stack0xffffffffffffffe8->param2 << 9;
    break;
  case 4:
    fVar2 = calcfreq(stack0xffffffffffffffe8->param1 / 128.0);
    uVar1 = ftou32(fVar2);
    this->dfreq = uVar1;
    break;
  default:
    local_28._4_4_ = stack0xffffffffffffffe8->param1;
    setup.mode = stack0xffffffffffffffe8->param2;
    local_28._0_4_ = (undefined4)(this->mode + -4);
    V2Flt::set(&this->fltl,(syVFlt *)local_28);
    V2Flt::set(&this->fltr,(syVFlt *)local_28);
  }
  return;
}

Assistant:

void set(const syVDist *para)
    {
        float x;

        mode = (int)para->mode;
        gain1 = powf(2.0f, (para->ingain - 32.0f) / 16.0f);

        switch (mode)
        {
        case OFF:
            break;

        case OVERDRIVE:
            gain2 = (para->param1 / 128.0f) / atan(gain1);
            offs = gain1 * 2.0f * ((para->param2 / 128.0f) - 0.5f);
            break;

        case CLIP:
            gain2 = para->param1 / 128.0f;
            offs = gain1 * 2.0f * ((para->param2 / 128.0f) - 0.5f);
            break;

        case BITCRUSHER:
            x = para->param1 * 256.0f + 1.0f;
            crush2 = (int)x;
            crush1 = gain1 * (32768.0f / x);
            crxor = ((int)para->param2) << 9;
            break;

        case DECIMATOR:
            dfreq = ftou32(calcfreq(para->param1 / 128.0f));
            break;

        default: // filters
        {
            syVFlt setup;
            setup.cutoff = para->param1;
            setup.reso = para->param2;
            setup.mode = (float)(mode - FLT_BASE);
            fltl.set(&setup);
            fltr.set(&setup);
        }
            break;
        }
    }